

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

void __thiscall slang::driver::Driver::addLibraryFiles(Driver *this,string_view pattern)

{
  long lVar1;
  void *pvVar2;
  char *__s;
  size_type __n;
  size_t __n_00;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  string_view libName;
  string_view pattern_00;
  
  __s = pattern._M_str;
  __n_00 = pattern._M_len;
  if (__n_00 == 0) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    pvVar2 = memchr(__s,0x3d,__n_00);
    uVar3 = -(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)__s;
  }
  if (uVar3 == 0xffffffffffffffff) {
    uVar3 = 0;
    pcVar5 = (char *)0x0;
    pcVar4 = __s;
  }
  else {
    lVar1 = uVar3 + 1;
    if (__n_00 <= uVar3) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 lVar1,__n_00);
    }
    __n_00 = __n_00 - lVar1;
    pcVar4 = __s + lVar1;
    pcVar5 = __s;
  }
  libName._M_str = pcVar5;
  libName._M_len = uVar3;
  pattern_00._M_str = pcVar4;
  pattern_00._M_len = __n_00;
  SourceLoader::addLibraryFiles(&this->sourceLoader,libName,pattern_00);
  return;
}

Assistant:

void Driver::addLibraryFiles(std::string_view pattern) {
    // Parse the pattern; there's an optional leading library name
    // followed by an equals sign. If not there, we use the default
    // library (represented by the empty string).
    std::string_view libraryName;
    auto index = pattern.find_first_of('=');
    if (index != std::string_view::npos) {
        libraryName = pattern.substr(0, index);
        pattern = pattern.substr(index + 1);
    }
    sourceLoader.addLibraryFiles(libraryName, pattern);
}